

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QName.cpp
# Opt level: O2

bool __thiscall xercesc_4_0::QName::operator==(QName *this,QName *qname)

{
  bool bVar1;
  XMLCh *str1;
  XMLCh *str2;
  
  str1 = this->fLocalPart;
  if (this->fPrefix == (XMLCh *)0x0 && str1 == (XMLCh *)0x0) {
    return qname->fPrefix == (XMLCh *)0x0 && qname->fLocalPart == (XMLCh *)0x0;
  }
  if (this->fURIId == 0) {
    str1 = getRawName(this);
    str2 = getRawName(qname);
  }
  else {
    if (this->fURIId != qname->fURIId) {
      return false;
    }
    str2 = qname->fLocalPart;
  }
  bVar1 = XMLString::equals(str1,str2);
  return bVar1;
}

Assistant:

bool QName::operator==(const QName& qname) const
{
    // if we are an unitialized QName, check that the other is unitialized too
    if (!fLocalPart && !fPrefix)
        return !qname.fLocalPart && !qname.fPrefix;

    if (fURIId == 0) // null URI
        return (XMLString::equals(getRawName(),qname.getRawName()));

    return ((fURIId == qname.getURI()) &&
           (XMLString::equals(fLocalPart, qname.getLocalPart())));
}